

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

void __thiscall
ArgumentParser::Instance::
Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
          (Instance *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *args,size_t pos)

{
  string_view *psVar1;
  string_view *psVar2;
  
  if (args->_M_len != 0) {
    psVar2 = args->_M_array;
    psVar1 = psVar2 + args->_M_len;
    do {
      Consume(this,pos,*psVar2);
      psVar2 = psVar2 + 1;
      pos = pos + 1;
    } while (psVar2 != psVar1);
  }
  FinishKeyword(this);
  return;
}

Assistant:

void Parse(Range const& args, std::size_t pos = 0)
  {
    for (cm::string_view arg : args) {
      this->Consume(pos++, arg);
    }
    this->FinishKeyword();
  }